

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O3

int __thiscall
Hpipe::Lexer::push_tok(Lexer *this,Source *source,char *beg,char *end,Type type,int grp,char delim)

{
  pointer *pppLVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer ppLVar3;
  iterator __position;
  int iVar4;
  bool bVar5;
  Lexem *pLVar6;
  Lexem *pLVar7;
  char *msg;
  char *str;
  Source *source_00;
  ErrorList *this_00;
  Lexem *item;
  string local_70;
  Type local_4c;
  char *local_48;
  Lexem *local_40;
  Source *local_38;
  
  local_4c = type;
  local_48 = beg;
  local_38 = source;
  if ((delim != ']') && (delim != ')')) {
    paVar2 = &local_70.field_2;
    local_70._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,beg,end);
    pLVar6 = Pool<Hpipe::Lexem,32>::
             New<Hpipe::Lexem::Type&,Hpipe::Source*&,char_const*&,std::__cxx11::string>
                       ((Pool<Hpipe::Lexem,32> *)&this->lexem_pool,&local_4c,&local_38,&local_48,
                        &local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    pLVar7 = this->last;
    local_40 = pLVar6;
    if (pLVar7 == (Lexem *)0x0) {
      pLVar7 = (this->stack_last).
               super__Vector_base<Hpipe::Lexem_*,_std::allocator<Hpipe::Lexem_*>_>._M_impl.
               super__Vector_impl_data._M_finish[-1];
      local_70._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"[","");
      bVar5 = Lexem::eq(pLVar7,&local_70);
      pLVar7->children[bVar5] = pLVar6;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      pLVar6->parent = pLVar7;
      pLVar7 = this->last;
    }
    else {
      pLVar7->next = pLVar6;
    }
    pLVar6->prev = pLVar7;
    this->last = pLVar6;
    if (grp < 0) {
      pLVar6->sibling = (Lexem *)0x0;
    }
    else {
      pLVar6->sibling = this->sibling[(uint)grp];
      this->sibling[(uint)grp] = pLVar6;
    }
    if ((delim == '[') || (delim == '(')) {
      __position._M_current =
           (this->stack_last).super__Vector_base<Hpipe::Lexem_*,_std::allocator<Hpipe::Lexem_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->stack_last).super__Vector_base<Hpipe::Lexem_*,_std::allocator<Hpipe::Lexem_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<Hpipe::Lexem*,std::allocator<Hpipe::Lexem*>>::
        _M_realloc_insert<Hpipe::Lexem*const&>
                  ((vector<Hpipe::Lexem*,std::allocator<Hpipe::Lexem*>> *)&this->stack_last,
                   __position,&local_40);
      }
      else {
        *__position._M_current = pLVar6;
        pppLVar1 = &(this->stack_last).
                    super__Vector_base<Hpipe::Lexem_*,_std::allocator<Hpipe::Lexem_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppLVar1 = *pppLVar1 + 1;
      }
      this->last = (Lexem *)0x0;
    }
    iVar4 = (int)local_48;
    goto LAB_00175dfe;
  }
  ppLVar3 = (this->stack_last).super__Vector_base<Hpipe::Lexem_*,_std::allocator<Hpipe::Lexem_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if ((this->stack_last).super__Vector_base<Hpipe::Lexem_*,_std::allocator<Hpipe::Lexem_*>_>._M_impl
      .super__Vector_impl_data._M_start == ppLVar3) {
    this_00 = this->error_list;
    source_00 = this->last->source;
    msg = "Closing parenthesis without opening correspondance.";
    str = beg;
LAB_00175df6:
    ErrorList::add(this_00,source_00,str,msg);
  }
  else {
    pLVar6 = ppLVar3[-1];
    this->last = pLVar6;
    (this->stack_last).super__Vector_base<Hpipe::Lexem_*,_std::allocator<Hpipe::Lexem_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppLVar3 + -1;
    if (delim == ']') {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"[","");
      bVar5 = Lexem::eq(pLVar6,&local_70);
LAB_00175cce:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if (bVar5 == false) {
        pLVar6 = this->last;
        this_00 = this->error_list;
        if (pLVar6 == (Lexem *)0x0) {
          source_00 = (Source *)0x0;
          str = (char *)0x0;
        }
        else {
          str = pLVar6->beg;
          source_00 = pLVar6->source;
        }
        msg = "Non matching parenthesis.";
        goto LAB_00175df6;
      }
    }
    else if (delim == ')') {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"(","");
      bVar5 = Lexem::eq(pLVar6,&local_70);
      goto LAB_00175cce;
    }
  }
  iVar4 = (int)beg;
LAB_00175dfe:
  return (int)end - iVar4;
}

Assistant:

int Lexer::push_tok( Source *source, const char *beg, const char *end, Lexem::Type type, int grp, char delim ) {
    if ( delim == ')' or delim == ']' ) {
        if ( stack_last.empty() ) {
            error_list.add( last->source, beg, "Closing parenthesis without opening correspondance." );
            return end - beg;
        }
        last = stack_last.back();
        stack_last.pop_back();
        if ( ( delim == ')' and not last->eq( "(" ) ) or ( delim == ']' and not last->eq( "[" ) ) )
            err( last, "Non matching parenthesis." );
        return end - beg;
    }

    Lexem *item = lexem_pool.New( type, source, beg, std::string{ beg, end } );
    if ( last ) {
        last->next = item;
    } else {
        Lexem *p = stack_last.back();
        p->children[ p->eq( "[" ) ] = item;
        item->parent = p;
    }
    item->prev = last;
    last = item;

    if ( grp >= 0 ) {
        item->sibling = sibling[ grp ];
        sibling[ grp ] = item;
    } else
        item->sibling = 0;

    // PRINT( String( beg, end ), grp, type );
    if ( delim == '(' or delim == '[' ) {
        stack_last.push_back( item );
        last = 0;
    }

    return end - beg;
}